

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scan.cpp
# Opt level: O2

void test_initialized_inclusive_scan<int,std::plus<int>>(uint W)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  char extraout_AL_00;
  int iVar3;
  ulong __n;
  long lVar4;
  Executor *this;
  uint uVar5;
  ulong uVar6;
  size_t i;
  ulong uVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&> local_368;
  Task alloc;
  ResultBuilder DOCTEST_RB;
  vector<int,_std::allocator<int>_> input;
  Task task2;
  Task task1;
  iterator dbeg;
  iterator send;
  iterator sbeg;
  vector<int,_std::allocator<int>_> golden;
  vector<int,_std::allocator<int>_> output;
  shared_ptr<tf::WorkerInterface> local_268;
  Result local_250;
  Taskflow taskflow;
  Executor executor;
  
  local_268.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_268.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)W,&local_268);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_268.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  tf::Taskflow::Taskflow(&taskflow);
  __n = 0;
  while( true ) {
    if (250000 < __n) {
      tf::Taskflow::~Taskflow(&taskflow);
      tf::Executor::~Executor(&executor);
      return;
    }
    std::
    vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ::clear(&taskflow._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           );
    std::vector<int,_std::allocator<int>_>::vector(&input,__n,(allocator_type *)&DOCTEST_RB);
    std::vector<int,_std::allocator<int>_>::vector(&output,__n,(allocator_type *)&DOCTEST_RB);
    std::vector<int,_std::allocator<int>_>::vector(&golden,__n,(allocator_type *)&DOCTEST_RB);
    sbeg._M_current = (int *)0x0;
    send._M_current = (int *)0x0;
    dbeg._M_current = (int *)0x0;
    uVar7 = 0;
    while( true ) {
      iVar3 = rand();
      uVar6 = (long)iVar3 % 10 & 0xffffffff;
      if (__n == uVar7) break;
      input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [uVar7] = (int)((long)iVar3 % 10);
      uVar7 = uVar7 + 1;
    }
    uVar7 = uVar6;
    for (lVar4 = 0;
        (int *)((long)input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar4) !=
        input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish; lVar4 = lVar4 + 4) {
      uVar5 = (int)uVar7 +
              *(int *)((long)input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start + lVar4);
      uVar7 = (ulong)uVar5;
      *(uint *)((long)golden.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar4) = uVar5;
    }
    tf::FlowBuilder::
    inclusive_scan<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>,int>
              ((FlowBuilder *)&task1,&taskflow,
               input.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,input.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish,
               output.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start,uVar6);
    DOCTEST_RB.super_AssertData._8_8_ = &input;
    DOCTEST_RB.super_AssertData.m_test_case = (TestCaseData *)&sbeg;
    DOCTEST_RB.super_AssertData.m_file = (char *)&send;
    DOCTEST_RB.super_AssertData._24_8_ = &dbeg;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_scan_cpp:189:35),_nullptr>
              ((FlowBuilder *)&alloc,(anon_class_32_4_6a670194 *)&taskflow);
    tf::FlowBuilder::
    inclusive_scan<std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,std::plus<int>,int>
              ((FlowBuilder *)&task2,&taskflow,(TestCaseData *)&sbeg,&send,&dbeg,uVar6);
    tf::Node::_precede(task1._node,alloc._node);
    tf::Node::_precede(alloc._node,task2._node);
    this = &executor;
    tf::Executor::run((Future<void> *)&DOCTEST_RB,this,&taskflow);
    std::__basic_future<void>::wait((__basic_future<void> *)&DOCTEST_RB,this);
    tf::Future<void>::~Future((Future<void> *)&DOCTEST_RB);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_368.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_scan.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xcd;
    DOCTEST_RB.super_AssertData.m_expr = "input == golden";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_368.lhs = &input;
    doctest::detail::Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&>::
    operator==<std::vector<int,_std::allocator<int>_>,_nullptr>(&local_250,&local_368,&golden);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_250);
    doctest::String::~String(&local_250.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') break;
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    local_368.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_scan.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0xce;
    DOCTEST_RB.super_AssertData.m_expr = "output == golden";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    local_368.lhs =
         (vector<int,_std::allocator<int>_> *)&output.super__Vector_base<int,_std::allocator<int>_>;
    doctest::detail::Expression_lhs<const_std::vector<int,_std::allocator<int>_>_&>::
    operator==<std::vector<int,_std::allocator<int>_>,_nullptr>(&local_250,&local_368,&golden);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)&DOCTEST_RB.super_AssertData,&local_250);
    doctest::String::~String(&local_250.m_decomp);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
    if (extraout_AL_00 != '\0') {
      pcVar1 = (code *)swi(3);
      (*pcVar1)(SUB84(dVar2,0));
      return;
    }
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&golden.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&output.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&input.super__Vector_base<int,_std::allocator<int>_>);
    __n = __n * 2 + 1;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void test_initialized_inclusive_scan(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow;

  size_t limit = std::is_same_v<T, std::string> ? 2500 : 250000;
  
  for(size_t n=0; n<=limit; n=n*2+1) {

    taskflow.clear();
    
    std::vector<T> input(n), output(n), golden(n); 
    typename std::vector<T>::iterator sbeg, send, dbeg;

    for(size_t i=0; i<n; i++) {
      if constexpr(std::is_same_v<T, std::string>) {
        input[i] = std::to_string(::rand() % 10);
      }
      else {
        input[i] = ::rand() % 10;
      }
    }

    T init;
      
    if constexpr(std::is_same_v<T, std::string>) {
      init = std::to_string(::rand() % 10);
    }
    else {
      init = ::rand() % 10;
    }


    std::inclusive_scan(
      input.begin(), input.end(), golden.begin(), B(), init
    );
    
    // out-of-place
    auto task1 = taskflow.inclusive_scan(
      input.begin(), input.end(), output.begin(), B(), init
    );  
    
    // enable stateful capture
    auto alloc = taskflow.emplace([&](){
      sbeg = input.begin();
      send = input.end();
      dbeg = input.begin();
    });
    
    // in-place
    auto task2 = taskflow.inclusive_scan(
      std::ref(sbeg), std::ref(send), std::ref(dbeg), B(), init
    );

    task1.precede(alloc);
    alloc.precede(task2);

    executor.run(taskflow).wait();

    REQUIRE(input == golden);
    REQUIRE(output == golden);
  }
}